

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeConstraints.cpp
# Opt level: O2

int __thiscall
OpenMD::FluctuatingChargeConstraints::getNumberOfFlucQAtoms(FluctuatingChargeConstraints *this)

{
  pointer ppAVar1;
  Molecule *pMVar2;
  pointer ppAVar3;
  Atom *pAVar4;
  int iVar5;
  bool bVar6;
  MoleculeIterator i;
  MoleculeIterator local_20;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  iVar5 = 0;
  if (this->hasFlucQ_ == true) {
    local_20._M_node = (_Base_ptr)0x0;
    pMVar2 = SimInfo::beginMolecule(this->info_,&local_20);
    iVar5 = 0;
    while (pMVar2 != (Molecule *)0x0) {
      if (pMVar2->constrainTotalCharge_ != true) {
        ppAVar3 = (pMVar2->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppAVar1 = (pMVar2->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if ((pMVar2->molStamp_->region_ < 0) || (this->constrainRegions_ == false)) {
          if (ppAVar3 != ppAVar1) goto LAB_0025e205;
          pAVar4 = (Atom *)0x0;
          do {
            bVar6 = pAVar4 == (Atom *)0x0;
            do {
              if (bVar6) goto LAB_0025e1ab;
              iVar5 = iVar5 + 1;
              ppAVar3 = ppAVar3 + 1;
              bVar6 = true;
            } while (ppAVar3 == ppAVar1);
LAB_0025e205:
            pAVar4 = *ppAVar3;
          } while( true );
        }
        if (ppAVar3 != ppAVar1) goto LAB_0025e223;
        pAVar4 = (Atom *)0x0;
        do {
          bVar6 = pAVar4 == (Atom *)0x0;
          do {
            if (bVar6) goto LAB_0025e1ab;
            iVar5 = iVar5 + 1;
            ppAVar3 = ppAVar3 + 1;
            bVar6 = true;
          } while (ppAVar3 == ppAVar1);
LAB_0025e223:
          pAVar4 = *ppAVar3;
        } while( true );
      }
      iVar5 = iVar5 + (int)((ulong)((long)(pMVar2->fluctuatingCharges_).
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pMVar2->fluctuatingCharges_).
                                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
LAB_0025e1ab:
      pMVar2 = SimInfo::nextMolecule(this->info_,&local_20);
    }
  }
  return iVar5;
}

Assistant:

int FluctuatingChargeConstraints::getNumberOfFlucQAtoms() {
    int nFlucq = 0;
    if (!initialized_) initialize();
    if (!hasFlucQ_) return 0;
    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      if (mol->constrainTotalCharge()) {
        nFlucq += mol->getNFluctuatingCharges();
      } else {
        int region = mol->getRegion();
        if (constrainRegions_ && region >= 0) {
          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            nFlucq++;
          }
        } else {
          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            nFlucq++;
          }
        }
      }
    }
    return nFlucq;
  }